

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::WriteSummary(cmGlobalGenerator *this,cmGeneratorTarget *target)

{
  bool bVar1;
  char *pcVar2;
  cmMakefile *pcVar3;
  Value *pVVar4;
  string *psVar5;
  Value *pVVar6;
  reference ppcVar7;
  ostream *poVar8;
  reference pbVar9;
  undefined1 local_9e0 [8];
  cmGeneratedFileStream json_fout;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_770;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_768;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_760;
  const_iterator li_3;
  string local_750;
  Value local_730;
  Value *local_708;
  Value *lj_source_labels;
  string local_6f8;
  char *local_6d8;
  char *svalue;
  string *local_6a8;
  string *sfp;
  cmSourceFile *sf;
  Value *local_670;
  Value *lj_source;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_660;
  const_iterator si;
  const_iterator sourcesEnd;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_648;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_640;
  const_iterator ci;
  value_type local_630;
  string local_610;
  undefined1 local_5f0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_598;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_590;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_588;
  const_iterator li_2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_558;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_550;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_548;
  const_iterator li_1;
  string local_538;
  allocator local_511;
  string local_510;
  undefined1 local_4f0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmakeDirectoryLabelsList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directoryLabelsList;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_498;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_490;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_488;
  const_iterator li;
  string local_478;
  undefined1 local_458 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  cmGeneratedFileStream fout;
  Value *lj_sources;
  Value *local_1a0;
  Value *lj_target_labels;
  Value local_170;
  Value *local_148;
  Value *lj_target;
  Value lj_root;
  string local_110;
  char *local_f0;
  char *cmakeDirectoryLabels;
  string local_e0;
  char *local_c0;
  char *directoryLabels;
  string local_b0;
  char *local_90;
  char *targetLabels;
  string json_file;
  undefined1 local_58 [8];
  string file;
  string dir;
  cmGeneratorTarget *target_local;
  cmGlobalGenerator *this_local;
  
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            ((string *)(file.field_2._M_local_buf + 8),target);
  std::__cxx11::string::string((string *)local_58,(string *)(file.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)local_58,"/Labels.txt");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targetLabels,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&file.field_2 + 8),"/Labels.json");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b0,"LABELS",(allocator *)((long)&directoryLabels + 7));
  pcVar2 = cmGeneratorTarget::GetProperty(target,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&directoryLabels + 7));
  local_90 = pcVar2;
  pcVar3 = cmTarget::GetMakefile(target->Target);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e0,"LABELS",(allocator *)((long)&cmakeDirectoryLabels + 7));
  pcVar2 = cmMakefile::GetProperty(pcVar3,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cmakeDirectoryLabels + 7));
  local_c0 = pcVar2;
  pcVar3 = cmTarget::GetMakefile(target->Target);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_110,"CMAKE_DIRECTORY_LABELS",(allocator *)((long)&lj_root.limit_ + 7))
  ;
  pcVar2 = cmMakefile::GetDefinition(pcVar3,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)((long)&lj_root.limit_ + 7));
  local_f0 = pcVar2;
  if (((local_90 == (char *)0x0) && (local_c0 == (char *)0x0)) && (pcVar2 == (char *)0x0)) {
    cmsys::SystemTools::RemoveFile((string *)local_58);
    cmsys::SystemTools::RemoveFile((string *)&targetLabels);
  }
  else {
    Json::Value::Value((Value *)&lj_target,objectValue);
    Json::Value::Value(&local_170,objectValue);
    pVVar4 = Json::Value::operator[]((Value *)&lj_target,"target");
    pVVar4 = Json::Value::operator=(pVVar4,&local_170);
    Json::Value::~Value(&local_170);
    local_148 = pVVar4;
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    Json::Value::Value((Value *)&lj_target_labels,psVar5);
    pVVar4 = Json::Value::operator[](local_148,"name");
    Json::Value::operator=(pVVar4,(Value *)&lj_target_labels);
    Json::Value::~Value((Value *)&lj_target_labels);
    Json::Value::Value((Value *)&lj_sources,arrayValue);
    pVVar4 = Json::Value::operator[](local_148,"labels");
    pVVar4 = Json::Value::operator=(pVVar4,(Value *)&lj_sources);
    Json::Value::~Value((Value *)&lj_sources);
    local_1a0 = pVVar4;
    Json::Value::Value((Value *)&fout.field_0x240,arrayValue);
    pVVar4 = Json::Value::operator[]((Value *)&lj_target,"sources");
    pVVar4 = Json::Value::operator=(pVVar4,(Value *)&fout.field_0x240);
    Json::Value::~Value((Value *)&fout.field_0x240);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::MakeDirectory(pcVar2);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)
               &labels.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar2,false,None);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_458);
    pcVar2 = local_90;
    if (local_90 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_478,pcVar2,(allocator *)((long)&li._M_current + 7));
      cmSystemTools::ExpandListArgument
                (&local_478,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_458,false);
      std::__cxx11::string::~string((string *)&local_478);
      std::allocator<char>::~allocator((allocator<char> *)((long)&li._M_current + 7));
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_458);
      if (!bVar1) {
        std::operator<<((ostream *)
                        &labels.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,"# Target labels\n");
        local_490._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_458);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_488,&local_490);
        while( true ) {
          local_498._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_458);
          bVar1 = __gnu_cxx::operator!=(&local_488,&local_498);
          if (!bVar1) break;
          poVar8 = std::operator<<((ostream *)
                                   &labels.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage," ");
          pbVar9 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_488);
          poVar8 = std::operator<<(poVar8,(string *)pbVar9);
          std::operator<<(poVar8,"\n");
          pVVar6 = local_1a0;
          pbVar9 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_488);
          Json::Value::Value((Value *)&directoryLabelsList.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,pbVar9);
          Json::Value::append(pVVar6,(Value *)&directoryLabelsList.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          Json::Value::~Value((Value *)&directoryLabelsList.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_488);
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&cmakeDirectoryLabelsList.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_4f0);
    pcVar2 = local_c0;
    if (local_c0 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_510,pcVar2,&local_511);
      cmSystemTools::ExpandListArgument
                (&local_510,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&cmakeDirectoryLabelsList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      std::__cxx11::string::~string((string *)&local_510);
      std::allocator<char>::~allocator((allocator<char> *)&local_511);
    }
    pcVar2 = local_f0;
    if (local_f0 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_538,pcVar2,(allocator *)((long)&li_1._M_current + 7));
      cmSystemTools::ExpandListArgument
                (&local_538,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_4f0,false);
      std::__cxx11::string::~string((string *)&local_538);
      std::allocator<char>::~allocator((allocator<char> *)((long)&li_1._M_current + 7));
    }
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&cmakeDirectoryLabelsList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((!bVar1) ||
       (bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_4f0), !bVar1)) {
      std::operator<<((ostream *)
                      &labels.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,"# Directory labels\n");
    }
    local_550._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&cmakeDirectoryLabelsList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_548,&local_550);
    while( true ) {
      local_558._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&cmakeDirectoryLabelsList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = __gnu_cxx::operator!=(&local_548,&local_558);
      if (!bVar1) break;
      poVar8 = std::operator<<((ostream *)
                               &labels.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage," ");
      pbVar9 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_548);
      poVar8 = std::operator<<(poVar8,(string *)pbVar9);
      std::operator<<(poVar8,"\n");
      pVVar6 = local_1a0;
      pbVar9 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_548);
      Json::Value::Value((Value *)&li_2,pbVar9);
      Json::Value::append(pVVar6,(Value *)&li_2);
      Json::Value::~Value((Value *)&li_2);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_548);
    }
    local_590._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_4f0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_588,&local_590);
    while( true ) {
      local_598._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_4f0);
      bVar1 = __gnu_cxx::operator!=(&local_588,&local_598);
      if (!bVar1) break;
      poVar8 = std::operator<<((ostream *)
                               &labels.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage," ");
      pbVar9 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_588);
      poVar8 = std::operator<<(poVar8,(string *)pbVar9);
      std::operator<<(poVar8,"\n");
      pVVar6 = local_1a0;
      pbVar9 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_588);
      Json::Value::Value((Value *)&sources.
                                   super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,pbVar9);
      Json::Value::append(pVVar6,(Value *)&sources.
                                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Json::Value::~Value((Value *)&sources.
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_588);
    }
    std::operator<<((ostream *)
                    &labels.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    "# Source files and their labels\n");
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
               &configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_5f0);
    pcVar3 = cmTarget::GetMakefile(target->Target);
    cmMakefile::GetConfigurations
              (&local_610,pcVar3,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_5f0,true);
    std::__cxx11::string::~string((string *)&local_610);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_5f0);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_630,"",(allocator *)((long)&ci._M_current + 7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_5f0,&local_630);
      std::__cxx11::string::~string((string *)&local_630);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ci._M_current + 7));
    }
    local_648._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_5f0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_640,&local_648);
    while( true ) {
      sourcesEnd._M_current =
           (cmSourceFile **)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_5f0);
      bVar1 = __gnu_cxx::operator!=
                        (&local_640,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&sourcesEnd);
      if (!bVar1) break;
      pbVar9 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_640);
      cmGeneratorTarget::GetSourceFiles
                (target,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                        &configs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,pbVar9);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_640);
    }
    si = cmRemoveDuplicates<std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                   ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                    &configs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    lj_source = (Value *)std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                                   ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                                    &configs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
    ::__normal_iterator<cmSourceFile**>
              ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                *)&local_660,
               (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                *)&lj_source);
    while (bVar1 = __gnu_cxx::operator!=(&local_660,&si), bVar1) {
      Json::Value::Value((Value *)&sf,objectValue);
      pVVar6 = Json::Value::append(pVVar4,(Value *)&sf);
      Json::Value::~Value((Value *)&sf);
      local_670 = pVVar6;
      ppcVar7 = __gnu_cxx::
                __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                ::operator*(&local_660);
      sfp = (string *)*ppcVar7;
      local_6a8 = cmSourceFile::GetFullPath((cmSourceFile *)sfp,(string *)0x0);
      poVar8 = std::operator<<((ostream *)
                               &labels.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (string *)local_6a8);
      std::operator<<(poVar8,"\n");
      Json::Value::Value((Value *)&svalue,local_6a8);
      pVVar6 = Json::Value::operator[](local_670,"file");
      Json::Value::operator=(pVVar6,(Value *)&svalue);
      Json::Value::~Value((Value *)&svalue);
      psVar5 = sfp;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_6f8,"LABELS",(allocator *)((long)&lj_source_labels + 7));
      pcVar2 = cmSourceFile::GetProperty((cmSourceFile *)psVar5,&local_6f8);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&lj_source_labels + 7));
      local_6d8 = pcVar2;
      if (pcVar2 != (char *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_458);
        Json::Value::Value(&local_730,arrayValue);
        pVVar6 = Json::Value::operator[](local_670,"labels");
        pVVar6 = Json::Value::operator=(pVVar6,&local_730);
        Json::Value::~Value(&local_730);
        pcVar2 = local_6d8;
        local_708 = pVVar6;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_750,pcVar2,(allocator *)((long)&li_3._M_current + 7));
        cmSystemTools::ExpandListArgument
                  (&local_750,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_458,false);
        std::__cxx11::string::~string((string *)&local_750);
        std::allocator<char>::~allocator((allocator<char> *)((long)&li_3._M_current + 7));
        local_768._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_458);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_760,&local_768);
        while( true ) {
          local_770._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_458);
          bVar1 = __gnu_cxx::operator!=(&local_760,&local_770);
          if (!bVar1) break;
          poVar8 = std::operator<<((ostream *)
                                   &labels.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage," ");
          pbVar9 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_760);
          poVar8 = std::operator<<(poVar8,(string *)pbVar9);
          std::operator<<(poVar8,"\n");
          pVVar6 = local_708;
          pbVar9 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_760);
          Json::Value::Value((Value *)&json_fout.field_0x240,pbVar9);
          Json::Value::append(pVVar6,(Value *)&json_fout.field_0x240);
          Json::Value::~Value((Value *)&json_fout.field_0x240);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_760);
        }
      }
      __gnu_cxx::
      __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
      ::operator++(&local_660);
    }
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_9e0,pcVar2,false,None);
    Json::operator<<((ostream *)local_9e0,(Value *)&lj_target);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_9e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_5f0);
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
               &configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_4f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cmakeDirectoryLabelsList.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_458);
    cmGeneratedFileStream::~cmGeneratedFileStream
              ((cmGeneratedFileStream *)
               &labels.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Json::Value::~Value((Value *)&lj_target);
  }
  std::__cxx11::string::~string((string *)&targetLabels);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmGlobalGenerator::WriteSummary(cmGeneratorTarget* target)
{
  // Place the labels file in a per-target support directory.
  std::string dir = target->GetSupportDirectory();
  std::string file = dir;
  file += "/Labels.txt";
  std::string json_file = dir + "/Labels.json";

#ifdef CMAKE_BUILD_WITH_CMAKE
  // Check whether labels are enabled for this target.
  const char* targetLabels = target->GetProperty("LABELS");
  const char* directoryLabels =
    target->Target->GetMakefile()->GetProperty("LABELS");
  const char* cmakeDirectoryLabels =
    target->Target->GetMakefile()->GetDefinition("CMAKE_DIRECTORY_LABELS");
  if (targetLabels || directoryLabels || cmakeDirectoryLabels) {
    Json::Value lj_root(Json::objectValue);
    Json::Value& lj_target = lj_root["target"] = Json::objectValue;
    lj_target["name"] = target->GetName();
    Json::Value& lj_target_labels = lj_target["labels"] = Json::arrayValue;
    Json::Value& lj_sources = lj_root["sources"] = Json::arrayValue;

    cmSystemTools::MakeDirectory(dir.c_str());
    cmGeneratedFileStream fout(file.c_str());

    std::vector<std::string> labels;

    // List the target-wide labels.  All sources in the target get
    // these labels.
    if (targetLabels) {
      cmSystemTools::ExpandListArgument(targetLabels, labels);
      if (!labels.empty()) {
        fout << "# Target labels\n";
        for (std::vector<std::string>::const_iterator li = labels.begin();
             li != labels.end(); ++li) {
          fout << " " << *li << "\n";
          lj_target_labels.append(*li);
        }
      }
    }

    // List directory labels
    std::vector<std::string> directoryLabelsList;
    std::vector<std::string> cmakeDirectoryLabelsList;

    if (directoryLabels) {
      cmSystemTools::ExpandListArgument(directoryLabels, directoryLabelsList);
    }

    if (cmakeDirectoryLabels) {
      cmSystemTools::ExpandListArgument(cmakeDirectoryLabels,
                                        cmakeDirectoryLabelsList);
    }

    if (!directoryLabelsList.empty() || !cmakeDirectoryLabelsList.empty()) {
      fout << "# Directory labels\n";
    }

    for (std::vector<std::string>::const_iterator li =
           directoryLabelsList.begin();
         li != directoryLabelsList.end(); ++li) {
      fout << " " << *li << "\n";
      lj_target_labels.append(*li);
    }

    for (std::vector<std::string>::const_iterator li =
           cmakeDirectoryLabelsList.begin();
         li != cmakeDirectoryLabelsList.end(); ++li) {
      fout << " " << *li << "\n";
      lj_target_labels.append(*li);
    }

    // List the source files with any per-source labels.
    fout << "# Source files and their labels\n";
    std::vector<cmSourceFile*> sources;
    std::vector<std::string> configs;
    target->Target->GetMakefile()->GetConfigurations(configs);
    if (configs.empty()) {
      configs.push_back("");
    }
    for (std::vector<std::string>::const_iterator ci = configs.begin();
         ci != configs.end(); ++ci) {
      target->GetSourceFiles(sources, *ci);
    }
    std::vector<cmSourceFile*>::const_iterator sourcesEnd =
      cmRemoveDuplicates(sources);
    for (std::vector<cmSourceFile*>::const_iterator si = sources.begin();
         si != sourcesEnd; ++si) {
      Json::Value& lj_source = lj_sources.append(Json::objectValue);
      cmSourceFile* sf = *si;
      std::string const& sfp = sf->GetFullPath();
      fout << sfp << "\n";
      lj_source["file"] = sfp;
      if (const char* svalue = sf->GetProperty("LABELS")) {
        labels.clear();
        Json::Value& lj_source_labels = lj_source["labels"] = Json::arrayValue;
        cmSystemTools::ExpandListArgument(svalue, labels);
        for (std::vector<std::string>::const_iterator li = labels.begin();
             li != labels.end(); ++li) {
          fout << " " << *li << "\n";
          lj_source_labels.append(*li);
        }
      }
    }
    cmGeneratedFileStream json_fout(json_file.c_str());
    json_fout << lj_root;
  } else
#endif
  {
    cmSystemTools::RemoveFile(file);
    cmSystemTools::RemoveFile(json_file);
  }
}